

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::IntegrationTest_exposeSingleCounter_Test::TestBody
          (IntegrationTest_exposeSingleCounter_Test *this)

{
  StringLike<std::__cxx11::basic_string<char>_> *substring;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar1;
  AssertHelper AStack_e8;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  shared_ptr<prometheus::Registry> registry;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  string counter_name;
  Response metrics;
  
  std::__cxx11::string::string((string *)&counter_name,"example_total",(allocator *)&metrics);
  IntegrationTest::RegisterSomeCounter((IntegrationTest *)&registry,(string *)this,&counter_name);
  IntegrationTest::FetchMetrics
            (&metrics,&this->super_IntegrationTest,
             &(this->super_IntegrationTest).default_metrics_path_);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"metrics.code","200",&metrics.code,(int *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
               ,0x6f,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_e8,(Message *)&gtest_ar_1);
    this_00 = &gtest_ar.message_;
    testing::internal::AssertHelper::~AssertHelper(&AStack_e8);
    if ((long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    testing::HasSubstr<std::__cxx11::string>(&local_a0,(testing *)&counter_name,substring);
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
              ((PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&gtest_ar,(internal *)&local_a0,matcher);
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
    ::operator()(&gtest_ar_1,&gtest_ar.success_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1564c7);
    std::__cxx11::string::~string((string *)&gtest_ar);
    std::__cxx11::string::~string((string *)&local_a0);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
                 ,0x70,pcVar1);
      testing::internal::AssertHelper::operator=(&AStack_e8,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper(&AStack_e8);
      if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
    this_00 = &gtest_ar_1.message_;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  IntegrationTest::Response::~Response(&metrics);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&counter_name);
  return;
}

Assistant:

TEST_F(IntegrationTest, exposeSingleCounter) {
  const std::string counter_name = "example_total";
  auto registry = RegisterSomeCounter(counter_name, default_metrics_path_);

  const auto metrics = FetchMetrics(default_metrics_path_);

  ASSERT_EQ(metrics.code, 200);
  EXPECT_THAT(metrics.body, HasSubstr(counter_name));
}